

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int vs_infer(bitstream *str,uint32_t *val,uint32_t ival)

{
  if (str->dir != VS_ENCODE) {
    *val = ival;
    return 0;
  }
  if (*val == ival) {
    return 0;
  }
  fprintf(_stderr,"Wrong infered value: %d != %d\n");
  return 1;
}

Assistant:

int vs_infer(struct bitstream *str, uint32_t *val, uint32_t ival) {
	if (str->dir == VS_ENCODE) {
		if (*val != ival) {
			fprintf (stderr, "Wrong infered value: %d != %d\n", *val, ival);
			return 1;
		}
	} else {
		*val = ival;
	}
	return 0;
}